

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

optional<unsigned_int> __thiscall
google::protobuf::json_internal::anon_unknown_5::TakeTimeDigitsWithSuffixAndAdvance
          (anon_unknown_5 *this,string_view *data,int max_digits,string_view end)

{
  string_view prefix;
  basic_string_view<char,_std::char_traits<char>_> *this_00;
  bool bVar1;
  int v1;
  int v2;
  LogMessage *pLVar2;
  const_reference pvVar3;
  size_type __pos;
  undefined4 in_register_00000014;
  basic_string_view<char,_std::char_traits<char>_> bVar4;
  size_t local_b8;
  char *local_b0;
  size_t local_80;
  char *local_78;
  uint32_t digit;
  uint local_64;
  int limit;
  uint32_t val;
  undefined8 local_58;
  LogMessageFatal local_50 [23];
  Voidify local_39;
  string *local_38;
  string *absl_log_internal_check_op_result;
  basic_string_view<char,_std::char_traits<char>_> *pbStack_28;
  int max_digits_local;
  string_view *data_local;
  string_view end_local;
  
  data_local = (string_view *)CONCAT44(in_register_00000014,max_digits);
  end_local._M_len = end._M_len;
  absl_log_internal_check_op_result._4_4_ = (uint32_t)data;
  pbStack_28 = (basic_string_view<char,_std::char_traits<char>_> *)this;
  v1 = absl::lts_20240722::log_internal::GetReferenceableValue
                 (absl_log_internal_check_op_result._4_4_);
  v2 = absl::lts_20240722::log_internal::GetReferenceableValue(9);
  local_38 = absl::lts_20240722::log_internal::Check_LEImpl_abi_cxx11_(v1,v2,"max_digits <= 9");
  if (local_38 != (string *)0x0) {
    _limit = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_38);
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_50,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/json/internal/parser.cc"
               ,0x2cf,(long)limit,limit._8_8_);
    pLVar2 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_50);
    absl::lts_20240722::log_internal::Voidify::operator&&(&local_39,pLVar2);
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_50);
  }
  local_64 = 0;
  digit = absl_log_internal_check_op_result._4_4_;
  local_38 = (string *)0x0;
  while (bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(pbStack_28),
        ((bVar1 ^ 0xffU) & 1) != 0) {
    if ((int)digit < 0) {
      std::optional<unsigned_int>::optional((optional<unsigned_int> *)&end_local._M_str);
      return (_Optional_base<unsigned_int,_true,_true>)
             (_Optional_base<unsigned_int,_true,_true>)end_local._M_str;
    }
    pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::operator[](pbStack_28,0);
    if (9 < (int)*pvVar3 - 0x30U) break;
    local_64 = ((int)*pvVar3 - 0x30U) + local_64 * 10;
    bVar4 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                      (pbStack_28,1,0xffffffffffffffff);
    local_80 = bVar4._M_len;
    pbStack_28->_M_len = local_80;
    local_78 = bVar4._M_str;
    pbStack_28->_M_str = local_78;
    digit = digit - 1;
  }
  prefix._M_str = (char *)end_local._M_len;
  prefix._M_len = (size_t)data_local;
  bVar1 = absl::lts_20240722::StartsWith(*pbStack_28,prefix);
  this_00 = pbStack_28;
  if (bVar1) {
    __pos = std::basic_string_view<char,_std::char_traits<char>_>::size
                      ((basic_string_view<char,_std::char_traits<char>_> *)&data_local);
    bVar4 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                      (this_00,__pos,0xffffffffffffffff);
    local_b8 = bVar4._M_len;
    pbStack_28->_M_len = local_b8;
    local_b0 = bVar4._M_str;
    pbStack_28->_M_str = local_b0;
    std::optional<unsigned_int>::optional<unsigned_int,_true>
              ((optional<unsigned_int> *)&end_local._M_str,&local_64);
  }
  else {
    std::optional<unsigned_int>::optional((optional<unsigned_int> *)&end_local._M_str);
  }
  return (_Optional_base<unsigned_int,_true,_true>)
         (_Optional_base<unsigned_int,_true,_true>)end_local._M_str;
}

Assistant:

absl::optional<uint32_t> TakeTimeDigitsWithSuffixAndAdvance(
    absl::string_view& data, int max_digits, absl::string_view end) {
  ABSL_DCHECK_LE(max_digits, 9);

  uint32_t val = 0;
  int limit = max_digits;
  while (!data.empty()) {
    if (limit-- < 0) {
      return absl::nullopt;
    }
    uint32_t digit = data[0] - '0';
    if (digit >= 10) {
      break;
    }

    val *= 10;
    val += digit;
    data = data.substr(1);
  }
  if (!absl::StartsWith(data, end)) {
    return absl::nullopt;
  }

  data = data.substr(end.size());
  return val;
}